

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

void __thiscall
helics::BrokerBase::loadInfoFromJson(BrokerBase *this,string *jsonString,bool runArgParser)

{
  int iVar1;
  int iVar2;
  element_type *this_00;
  element_type *peVar3;
  value_t vVar4;
  json_value jVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  reference pvVar11;
  size_type sVar12;
  shared_ptr<helics::helicsCLI11App> sVar13;
  allocator<char> local_599;
  shared_ptr<helics::helicsCLI11App> app;
  shared_ptr<CLI::Config> local_588;
  json doc;
  shared_ptr<helics::helicsCLI11App> sApp;
  __shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2> local_558 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_550;
  data local_548;
  istringstream jstringHelicsSub;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_530 [47];
  istringstream jstringHelics;
  istringstream jstring;
  
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(&doc,(nullptr_t)0x0);
  fileops::loadJson((fileops *)&local_548,(string *)jsonString);
  jVar5 = doc.m_data.m_value;
  vVar4 = doc.m_data.m_type;
  doc.m_data.m_type = local_548.m_type;
  local_548.m_type = vVar4;
  doc.m_data.m_value = local_548.m_value;
  local_548.m_value = jVar5;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_548);
  bVar7 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[7],_0>(&doc,(char (*) [7])0x346dc9);
  if (bVar7) {
    pvVar11 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&doc,"helics");
    bVar8 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[7],_0>(pvVar11,(char (*) [7])0x346dc9);
    pvVar11 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&doc,"helics");
    bVar9 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[7],_0>(pvVar11,(char (*) [7])0x34daba);
  }
  else {
    bVar8 = false;
    bVar9 = false;
  }
  bVar10 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[7],_0>(&doc,(char (*) [7])0x34daba);
  if (runArgParser) {
    sVar13 = generateBaseCLI((BrokerBase *)&app);
    (*this->_vptr_BrokerBase[8])
              (&sApp,this,
               sVar13.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    this_00 = app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<CLI::App,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<helics::helicsCLI11App,void>
              (local_558,
               &sApp.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>);
    CLI::App::add_subcommand(&this_00->super_App,(App_p *)local_558);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_550);
    ((app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_App)
    .allow_extras_ = true;
    sVar12 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find(jsonString,'{',0);
    if (sVar12 == 0xffffffffffffffff) {
      std::ifstream::ifstream(&jstring,(string *)jsonString,_S_in);
      CLI::App::parse_from_stream
                (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->super_App,(istream *)&jstring);
      iVar1 = (int)(istream *)&jstring;
      if (bVar7) {
        std::ios::clear((int)*(undefined8 *)(_jstring + -0x18) + iVar1);
        std::istream::seekg(&jstring,0,0);
        std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>
                  ((shared_ptr<CLI::Config> *)&jstringHelicsSub);
        _Var6._M_p = _jstringHelicsSub;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&jstringHelics,"helics",(allocator<char> *)&local_588);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (_Var6._M_p + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &jstringHelics);
        std::__cxx11::string::~string((string *)&jstringHelics);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
        CLI::App::parse_from_stream
                  (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_App,(istream *)&jstring);
        iVar2 = (int)(istream *)&jstring;
        if (bVar8 != false) {
          std::ios::clear((int)*(undefined8 *)(_jstring + -0x18) + iVar2);
          std::istream::seekg(&jstring,0,0);
          std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>
                    ((shared_ptr<CLI::Config> *)&jstringHelicsSub);
          _Var6._M_p = _jstringHelicsSub;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&jstringHelics,"helics.helics",(allocator<char> *)&local_588);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (_Var6._M_p + 0x30),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &jstringHelics);
          std::__cxx11::string::~string((string *)&jstringHelics);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
          CLI::App::parse_from_stream
                    (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_App,(istream *)&jstring);
        }
        if (bVar9 != false) {
          std::ios::clear(iVar2 + (int)*(undefined8 *)(_jstring + -0x18));
          std::istream::seekg(&jstring,0,0);
          std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>
                    ((shared_ptr<CLI::Config> *)&jstringHelicsSub);
          _Var6._M_p = _jstringHelicsSub;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&jstringHelics,"helics.broker",(allocator<char> *)&local_588);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (_Var6._M_p + 0x30),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &jstringHelics);
          std::__cxx11::string::~string((string *)&jstringHelics);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
          CLI::App::parse_from_stream
                    (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_App,(istream *)&jstring);
        }
      }
      if (bVar10) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(_jstring + -0x18));
        std::istream::seekg(&jstring,0,0);
        std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>
                  ((shared_ptr<CLI::Config> *)&jstringHelicsSub);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&jstringHelics,"broker",(allocator<char> *)&local_588);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (_jstringHelicsSub + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &jstringHelics);
        std::__cxx11::string::~string((string *)&jstringHelics);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
        CLI::App::parse_from_stream
                  (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_App,(istream *)&jstring);
      }
      std::ifstream::~ifstream(&jstring);
    }
    else {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)&jstring,(string *)jsonString,_S_in);
      CLI::App::parse_from_stream
                (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->super_App,(istream *)&jstring);
      if (bVar7) {
        std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>
                  ((shared_ptr<CLI::Config> *)&jstringHelicsSub);
        _Var6._M_p = _jstringHelicsSub;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&jstringHelics,"helics",(allocator<char> *)&local_588);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (_Var6._M_p + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &jstringHelics);
        std::__cxx11::string::~string((string *)&jstringHelics);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&jstringHelics,(string *)jsonString,_S_in);
        CLI::App::parse_from_stream
                  (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_App,(istream *)&jstringHelics);
        if (bVar8 != false) {
          std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>(&local_588);
          peVar3 = local_588.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&jstringHelicsSub,"helics.helics",&local_599);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &peVar3[1].items.
                     super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &jstringHelicsSub);
          std::__cxx11::string::~string((string *)&jstringHelicsSub);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_588.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&jstringHelicsSub,(string *)jsonString,_S_in);
          CLI::App::parse_from_stream
                    (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_App,(istream *)&jstringHelicsSub);
          std::__cxx11::istringstream::~istringstream((istringstream *)&jstringHelicsSub);
        }
        if (bVar9 != false) {
          std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>(&local_588);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&jstringHelicsSub,"helics.broker",&local_599);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &local_588.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                     .items.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &jstringHelicsSub);
          std::__cxx11::string::~string((string *)&jstringHelicsSub);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_588.super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&jstringHelicsSub,(string *)jsonString,_S_in);
          CLI::App::parse_from_stream
                    (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_App,(istream *)&jstringHelicsSub);
          std::__cxx11::istringstream::~istringstream((istringstream *)&jstringHelicsSub);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&jstringHelics);
      }
      if (bVar10) {
        std::dynamic_pointer_cast<CLI::ConfigBase,CLI::Config>
                  ((shared_ptr<CLI::Config> *)&jstringHelicsSub);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&jstringHelics,"broker",(allocator<char> *)&local_588);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (_jstringHelicsSub + 0x30),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &jstringHelics);
        std::__cxx11::string::~string((string *)&jstringHelics);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_530);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&jstringHelics,(string *)jsonString,_S_in);
        CLI::App::parse_from_stream
                  (&(app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_App,(istream *)&jstringHelics);
        std::__cxx11::istringstream::~istringstream((istringstream *)&jstringHelics);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&jstring);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &sApp.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &app.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&doc.m_data);
  return;
}

Assistant:

void BrokerBase::loadInfoFromJson(const std::string& jsonString, bool runArgParser)
{
    nlohmann::json doc;
    try {
        doc = fileops::loadJson(jsonString);
    }
    catch (const std::invalid_argument& iarg) {
        throw(helics::InvalidParameter(iarg.what()));
    }
    const bool hasHelicsSection = doc.contains("helics");
    bool hasHelicsSubSection{false};
    bool hasHelicsBrokerSubSection{false};
    if (hasHelicsSection) {
        hasHelicsSubSection = doc["helics"].contains("helics");
        hasHelicsBrokerSubSection = doc["helics"].contains("broker");
    }
    const bool hasBrokerSection = doc.contains("broker");

    if (runArgParser) {
        auto app = generateBaseCLI();
        auto sApp = generateCLI();
        app->add_subcommand(sApp);
        app->allow_extras();
        try {
            if (jsonString.find('{') != std::string::npos) {
                std::istringstream jstring(jsonString);
                app->parse_from_stream(jstring);
                if (hasHelicsSection) {
                    app->get_config_formatter_base()->section("helics");
                    std::istringstream jstringHelics(jsonString);
                    app->parse_from_stream(jstringHelics);
                    if (hasHelicsSubSection) {
                        app->get_config_formatter_base()->section("helics.helics");
                        std::istringstream jstringHelicsSub(jsonString);
                        app->parse_from_stream(jstringHelicsSub);
                    }
                    if (hasHelicsBrokerSubSection) {
                        app->get_config_formatter_base()->section("helics.broker");
                        std::istringstream jstringHelicsSub(jsonString);
                        app->parse_from_stream(jstringHelicsSub);
                    }
                }
                if (hasBrokerSection) {
                    app->get_config_formatter_base()->section("broker");
                    std::istringstream jstringBroker(jsonString);
                    app->parse_from_stream(jstringBroker);
                }
            } else {
                std::ifstream file(jsonString);
                app->parse_from_stream(file);
                if (hasHelicsSection) {
                    file.clear();
                    file.seekg(0);
                    app->get_config_formatter_base()->section("helics");
                    app->parse_from_stream(file);
                    if (hasHelicsSubSection) {
                        file.clear();
                        file.seekg(0);
                        app->get_config_formatter_base()->section("helics.helics");
                        app->parse_from_stream(file);
                    }
                    if (hasHelicsBrokerSubSection) {
                        file.clear();
                        file.seekg(0);
                        app->get_config_formatter_base()->section("helics.broker");
                        app->parse_from_stream(file);
                    }
                }
                if (hasBrokerSection) {
                    file.clear();
                    file.seekg(0);
                    app->get_config_formatter_base()->section("broker");
                    app->parse_from_stream(file);
                }
            }
        }
        catch (const CLI::Error& clierror) {
            throw(InvalidIdentifier(clierror.what()));
        }
    }
}